

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wversion_time(OutputFile *this)

{
  output_version_time((ostream *)
                      &((this->blocks).
                        super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                       super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->stream);
  return this;
}

Assistant:

OutputFile & OutputFile::wversion_time ()
{
	output_version_time (stream ());
	return *this;
}